

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Boost::set(V2Boost *this,syVBoost *para)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float __x;
  
  fVar4 = para->amount;
  bVar3 = (int)fVar4 != 0;
  this->enabled = bVar3;
  if (bVar3) {
    fVar4 = exp2f(fVar4 * 0.0078125);
    __x = fVar4 + fVar4;
    if (__x < 0.0) {
      fVar5 = sqrtf(__x);
    }
    else {
      fVar5 = SQRT(__x);
    }
    fVar8 = fVar4 + -1.0;
    fVar9 = fVar4 + 1.0;
    uVar1 = this->inst->SRfcBoostCos;
    uVar2 = this->inst->SRfcBoostSin;
    fVar5 = fVar5 * (float)uVar2;
    fVar6 = fVar9 - fVar8 * (float)uVar1;
    fVar7 = fVar8 * (float)uVar1 + fVar9;
    fVar10 = 1.0 / (fVar7 + fVar5);
    this->a1 = fVar10 * ((float)uVar1 * fVar9 + fVar8) * -2.0;
    this->a2 = fVar10 * (fVar7 - fVar5);
    this->b0 = fVar10 * fVar4 * (fVar5 + fVar6);
    this->b1 = fVar10 * __x * (fVar8 - (float)uVar1 * fVar9);
    this->b2 = fVar4 * (fVar6 - fVar5) * fVar10;
  }
  return;
}

Assistant:

void set(const syVBoost *para)
    {
        enabled = ((int)para->amount) != 0;
        if (!enabled)
            return;

        COVER("BOOST set");

        // A = 10^(dBgain/40), or a rough approximation anyway
        float A = powf(2.0f, para->amount / 128.0f);

        // V2 code computes beta = sqrt((A^2 + 1) - (A-1)^2) for some reason
        // but applying the binomial formula just gives sqrt(2A)
        float beta = sqrtf(2.0f * A);

        // temp vars
        float bs = beta * inst->SRfcBoostSin;
        float Am1 = A - 1.0f;
        float Ap1 = A + 1.0f;
        float cAm1 = Am1 * inst->SRfcBoostCos;
        float cAp1 = Ap1 * inst->SRfcBoostCos;

        // a0 = (A+1) + (A-1)*cos + beta*sin
        float ia0 = 1.0f / (Ap1 + cAm1 + bs);

        b1 = 2.0f * A * (Am1 - cAp1) * ia0;
        a1 = -2.0f * (Am1 + cAp1) * ia0;
        a2 = (Ap1 + cAm1 - bs) * ia0;
        b0 = A * (Ap1 - cAm1 + bs) * ia0;
        b2 = A * (Ap1 - cAm1 - bs) * ia0;
    }